

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings_tests.cpp
# Opt level: O1

void __thiscall blockencodings_tests::SimpleRoundTripTest::test_method(SimpleRoundTripTest *this)

{
  _Atomic_word *p_Var1;
  CTxMemPool *this_00;
  element_type *peVar2;
  bool bVar3;
  ReadStatus RVar4;
  int iVar5;
  unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *puVar6;
  uint64_t nonce;
  unsigned_long uVar7;
  long lVar8;
  CheckBlockFn *__x;
  size_t *psVar9;
  uchar *puVar10;
  uchar *puVar11;
  size_t *psVar12;
  char *pcVar13;
  vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_> *args_3;
  iterator in_R9;
  iterator pvVar14;
  iterator pvVar15;
  long in_FS_OFFSET;
  readonly_property<bool> rVar16;
  byte bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  const_string file_07;
  const_string file_08;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_00;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  check_type cVar20;
  char *local_868;
  char *local_860;
  undefined1 *local_858;
  undefined1 *local_850;
  char *local_848;
  char *local_840;
  undefined1 *local_838;
  undefined1 *local_830;
  char *local_828;
  char *local_820;
  undefined1 local_818 [56];
  char *local_7e0;
  char *local_7d8;
  char *local_7d0;
  char *local_7c8;
  undefined1 *local_7c0;
  undefined1 *local_7b8;
  char *local_7b0;
  char *local_7a8;
  char *local_7a0;
  char *local_798;
  undefined1 *local_790;
  undefined1 *local_788;
  char *local_780;
  char *local_778;
  bool mutated;
  char *local_768;
  char *local_760;
  undefined1 *local_758;
  undefined1 *local_750;
  char *local_748;
  char *local_740;
  undefined1 *local_738;
  undefined1 *local_730;
  char *local_728;
  char *local_720;
  undefined1 *local_718;
  undefined1 *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  undefined1 *local_6e8;
  undefined1 *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  undefined1 *local_6b8;
  undefined1 *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  undefined1 *local_688;
  undefined1 *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  undefined1 *local_658;
  undefined1 *local_650;
  char *local_648;
  char *local_640;
  undefined1 local_638 [32];
  undefined1 *local_618;
  undefined1 *local_610;
  char *local_608;
  char *local_600;
  TestMemPoolEntryHelper entry;
  string *local_5b0;
  string *local_5a8;
  char *local_5a0;
  assertion_result local_598;
  string *local_580;
  undefined1 local_578 [32];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  undefined1 local_538 [16];
  shared_count asStack_528 [2];
  undefined1 local_518 [32];
  string local_4f8;
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [16];
  CBlock block3;
  _Any_data local_430;
  code *local_420;
  CBlock block2;
  CBlockHeaderAndShortTxIDs shortIDs2;
  CBlockHeaderAndShortTxIDs shortIDs;
  PartiallyDownloadedBlock partialBlock;
  CBlock block;
  FastRandomContext rand_ctx;
  assertion_result local_58;
  string **local_40;
  long local_38;
  
  local_638._8_8_ = local_638._0_8_;
  local_818._8_8_ = local_818._0_8_;
  bVar17 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar13 = "m_node.mempool";
  puVar6 = inline_assertion_check<true,std::unique_ptr<CTxMemPool,std::default_delete<CTxMemPool>>&>
                     (&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.
                       super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
                      ,0x40,"test_method","m_node.mempool");
  this_00 = (puVar6->_M_t).super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  entry.nFee = 0;
  entry.time.__d.__r = (duration)0x0;
  entry.nHeight = 1;
  entry.m_sequence = 0;
  entry.spendsCoinbase = false;
  entry.sigOpCost = 4;
  entry.lp.height = 0;
  entry.lp.time = 0;
  entry.lp.maxInputBlock = (CBlockIndex *)0x0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  partialBlock.prefilled_count = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._1_15_ = SUB1615((undefined1  [16])0x0,1);
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0x2a;
  FastRandomContext::FastRandomContext(&rand_ctx,(uint256 *)&partialBlock);
  BuildBlockTestCase(&block,&rand_ctx);
  criticalblock1.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock1.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock1.super_unique_lock);
  criticalblock2.super_unique_lock._M_device = &(this_00->cs).super_recursive_mutex;
  criticalblock2.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock2.super_unique_lock);
  TestMemPoolEntryHelper::FromTx
            ((CTxMemPoolEntry *)&partialBlock,&entry,
             block.vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 2);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&partialBlock);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)(partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 4));
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&partialBlock.txn_available.
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (partialBlock.txn_available.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               partialBlock.txn_available.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_608 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_600 = "";
  local_618 = &boost::unit_test::basic_cstring<char_const>::null;
  local_610 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x47;
  file.m_begin = (iterator)&local_608;
  msg.m_end = in_R9;
  msg.m_begin = pcVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_618,msg);
  shortIDs.shorttxidk1._0_1_ = 0;
  shortIDs.shorttxidk0 = (uint64_t)&PTR__lazy_ostream_013abb30;
  shortIDs.nonce = (uint64_t)boost::unit_test::lazy_ostream::inst;
  shortIDs.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xf6cf21;
  CTxMemPool::get((CTxMemPool *)local_578,(uint256 *)this_00);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_578._8_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_818._0_8_ = (_func_int **)0x0;
  }
  else {
    local_818._0_8_ = SEXT48(*(_Atomic_word *)(local_578._8_8_ + 8));
  }
  local_58._0_8_ = local_818;
  local_4d8._0_8_ = (element_type *)0x4;
  shortIDs2.shorttxidk0._0_1_ = (_func_int **)local_818._0_8_ == (_func_int **)0x4;
  shortIDs2.shorttxidk1 = 0;
  shortIDs2.nonce = 0;
  block2.super_CBlockHeader.nVersion._0_1_ = 0xf3;
  block2.super_CBlockHeader._1_7_ = 0xe626;
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '`';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\'';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = 0xe6;
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013abed0;
  partialBlock.prefilled_count = (size_t)&local_58;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_638._0_8_ = local_4d8;
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block3.super_CBlockHeader._0_8_ = &PTR__lazy_ostream_013abed0;
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._20_8_ = local_638;
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_8_ =
       boost::unit_test::lazy_ostream::inst;
  pvVar14 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&shortIDs2,(lazy_ostream *)&shortIDs,1,2,REQUIRE,0xe62790,
             (size_t)&block2,0x47,(CTxMemPoolEntry *)&partialBlock,"SHARED_TX_OFFSET + 0",&block3);
  boost::detail::shared_count::~shared_count((shared_count *)&shortIDs2.nonce);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_578._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_578._8_8_);
  }
  nonce = FastRandomContext::rand64(&rand_ctx);
  CBlockHeaderAndShortTxIDs::CBlockHeaderAndShortTxIDs(&shortIDs,&block,nonce);
  local_638._16_16_ = (undefined1  [16])0x0;
  local_638._0_16_ = (undefined1  [16])0x0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&shortIDs.shorttxids;
  args_3 = &shortIDs.prefilledtxn;
  SerializeMany<DataStream,CBlockHeader,unsigned_long,Wrapper<VectorFormatter<CustomUintFormatter<6,false>>,std::vector<unsigned_long,std::allocator<unsigned_long>>const&>,std::vector<PrefilledTransaction,std::allocator<PrefilledTransaction>>>
            ((DataStream *)local_638,&shortIDs.header,&shortIDs.nonce,
             (Wrapper<VectorFormatter<CustomUintFormatter<6,_false>_>,_const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&>
              *)&partialBlock,args_3);
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  shortIDs2.header.nTime = 0;
  shortIDs2.header.nBits = 0;
  shortIDs2.header.nNonce = 0;
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  shortIDs2.header.nVersion = 0;
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  shortIDs2.prefilledtxn.
  super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  shortIDs2.prefilledtxn.
  super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shortIDs2.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shortIDs2.prefilledtxn.
  super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shortIDs2.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shortIDs2.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  CBlockHeaderAndShortTxIDs::
  SerializationOps<DataStream,CBlockHeaderAndShortTxIDs,ActionUnserialize>(&shortIDs2,local_638);
  partialBlock.mempool_count = 0;
  partialBlock.extra_count = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  partialBlock.prefilled_count = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  partialBlock.header.nVersion = 0;
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  partialBlock.header.nTime = 0;
  partialBlock.header.nBits = 0;
  partialBlock.header.nNonce = 0;
  partialBlock.m_check_block_mock.super__Function_base._M_functor = (_Any_data)0x0;
  partialBlock.m_check_block_mock.super__Function_base._M_manager = (_Manager_type)0x0;
  partialBlock.m_check_block_mock._M_invoker = (_Invoker_type)0x0;
  local_648 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_640 = "";
  local_658 = &boost::unit_test::basic_cstring<char_const>::null;
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x54;
  file_00.m_begin = (iterator)&local_648;
  msg_00.m_end = pvVar14;
  msg_00.m_begin = (iterator)args_3;
  partialBlock.pool = this_00;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_658,
             msg_00);
  _cVar20 = 0x2d5957;
  RVar4 = PartiallyDownloadedBlock::InitData(&partialBlock,&shortIDs2,&empty_extra_txn);
  block2.super_CBlockHeader.nVersion._0_1_ = RVar4 == READ_STATUS_OK;
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_578._0_8_ = "partialBlock.InitData(shortIDs2, empty_extra_txn) == READ_STATUS_OK";
  local_578._8_8_ = "";
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block3.super_CBlockHeader._0_8_ = &PTR__lazy_ostream_013abc70;
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_668 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_660 = "";
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x0;
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._20_8_ =
       (CTxMemPool *)local_578;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&block2,(lazy_ostream *)&block3,1,0,WARN,_cVar20,(size_t)&local_668
             ,0x54);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc));
  local_678 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_670 = "";
  local_688 = &boost::unit_test::basic_cstring<char_const>::null;
  local_680 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x55;
  file_01.m_begin = (iterator)&local_678;
  msg_01.m_end = pvVar15;
  msg_01.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_688,
             msg_01);
  _cVar20 = 0x2d5a3e;
  block2.super_CBlockHeader.nVersion._0_1_ =
       PartiallyDownloadedBlock::IsTxAvailable(&partialBlock,0);
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_578._0_8_ = "partialBlock.IsTxAvailable(0)";
  local_578._8_8_ = "";
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block3.super_CBlockHeader._0_8_ = &PTR__lazy_ostream_013abc70;
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_698 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_690 = "";
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x0;
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._20_8_ =
       (CTxMemPool *)local_578;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&block2,(lazy_ostream *)&block3,1,0,WARN,_cVar20,(size_t)&local_698
             ,0x55);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc));
  local_6a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_6a0 = "";
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x56;
  file_02.m_begin = (iterator)&local_6a8;
  msg_02.m_end = pvVar15;
  msg_02.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_6b8,
             msg_02);
  _cVar20 = 0x2d5b25;
  bVar3 = PartiallyDownloadedBlock::IsTxAvailable(&partialBlock,1);
  block2.super_CBlockHeader.nVersion._0_1_ = !bVar3;
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_578._0_8_ = "!partialBlock.IsTxAvailable(1)";
  local_578._8_8_ = "";
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block3.super_CBlockHeader._0_8_ = &PTR__lazy_ostream_013abc70;
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_6c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_6c0 = "";
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x0;
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._20_8_ =
       (CTxMemPool *)local_578;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&block2,(lazy_ostream *)&block3,1,0,WARN,_cVar20,(size_t)&local_6c8
             ,0x56);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc));
  local_6d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_6d0 = "";
  local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x57;
  file_03.m_begin = (iterator)&local_6d8;
  msg_03.m_end = pvVar15;
  msg_03.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_6e8,
             msg_03);
  _cVar20 = 0x2d5c0e;
  block2.super_CBlockHeader.nVersion._0_1_ =
       PartiallyDownloadedBlock::IsTxAvailable(&partialBlock,2);
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_578._0_8_ = "partialBlock.IsTxAvailable(2)";
  local_578._8_8_ = "";
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block3.super_CBlockHeader._0_8_ = &PTR__lazy_ostream_013abc70;
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_6f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_6f0 = "";
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x0;
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._20_8_ =
       (CTxMemPool *)local_578;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&block2,(lazy_ostream *)&block3,1,0,WARN,_cVar20,(size_t)&local_6f8
             ,0x57);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc));
  local_708 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_700 = "";
  local_718 = &boost::unit_test::basic_cstring<char_const>::null;
  local_710 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x59;
  file_04.m_begin = (iterator)&local_708;
  msg_04.m_end = pvVar15;
  msg_04.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_718,
             msg_04);
  local_578._8_8_ = local_578._8_8_ & 0xffffffffffffff00;
  local_578._0_8_ = &PTR__lazy_ostream_013abb30;
  local_578._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_578._24_8_ = "";
  CTxMemPool::get((CTxMemPool *)local_4d8,(uint256 *)this_00);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4d8._8_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_538._0_8_ = 0;
  }
  else {
    local_538._0_8_ = SEXT48(*(_Atomic_word *)(local_4d8._8_8_ + 8));
  }
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_538._0_8_ == 5);
  local_518._0_8_ = &local_598;
  local_598._0_8_ = (char *)0x5;
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_818._8_8_ = "";
  local_818._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block3.super_CBlockHeader._0_8_ = &PTR__lazy_ostream_013abed0;
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._20_8_ = &local_4f8;
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_8_ =
       boost::unit_test::lazy_ostream::inst;
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block2.super_CBlockHeader.nVersion._0_1_ = 0xd0;
  block2.super_CBlockHeader._1_7_ = 0x13abe;
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_8_ =
       boost::unit_test::lazy_ostream::inst;
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x2;
  local_4f8._M_dataplus._M_p = local_538;
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._20_8_ =
       (element_type *)local_518;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)local_578,1,2,REQUIRE,0xe62790,(size_t)local_818,0x59,&block3
             ,"SHARED_TX_OFFSET + 1",&block2);
  boost::detail::shared_count::~shared_count(&local_58.m_message.pn);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4d8._8_8_);
  }
  uVar7 = CTxMemPool::size(this_00);
  CTxMemPool::removeRecursive
            (this_00,block.vtx.
                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[2].
                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             REPLACED);
  local_728 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_720 = "";
  local_738 = &boost::unit_test::basic_cstring<char_const>::null;
  local_730 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x5d;
  file_05.m_begin = (iterator)&local_728;
  msg_05.m_end = pvVar15;
  msg_05.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_738,
             msg_05);
  local_578._8_8_ = local_578._8_8_ & 0xffffffffffffff00;
  local_578._0_8_ = &PTR__lazy_ostream_013abb30;
  local_578._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_578._24_8_ = "";
  local_518._0_8_ = CTxMemPool::size(this_00);
  local_538._0_8_ = uVar7 - 1;
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_518._0_8_ == local_538._0_8_);
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_818._8_8_ = "";
  local_818._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block3.super_CBlockHeader._0_8_ = &PTR__lazy_ostream_013abb70;
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._20_8_ = local_4d8;
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_8_ =
       boost::unit_test::lazy_ostream::inst;
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block2.super_CBlockHeader.nVersion._0_1_ = 0x70;
  block2.super_CBlockHeader._1_7_ = 0x13abb;
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_8_ =
       boost::unit_test::lazy_ostream::inst;
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._20_8_ = &local_4f8;
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x2;
  local_4f8._M_dataplus._M_p = local_538;
  local_4d8._0_8_ = (element_type *)local_518;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)local_578,1,2,REQUIRE,0xe62869,(size_t)local_818,0x5d,&block3
             ,"poolSize - 1",&block2);
  boost::detail::shared_count::~shared_count(&local_58.m_message.pn);
  block2.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  block2.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  block2.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  block2.super_CBlockHeader.nTime = 0;
  block2.super_CBlockHeader.nBits = 0;
  block2.super_CBlockHeader.nNonce = 0;
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block2.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block2.super_CBlockHeader._1_7_ = 0;
  block2.super_CBlockHeader.nVersion._0_1_ = 0;
  block2.fChecked = false;
  block2.m_checked_witness_commitment = false;
  block2.m_checked_merkle_root = false;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&block3,&partialBlock.txn_available);
  puVar10 = block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x14;
  psVar12 = &partialBlock.prefilled_count;
  psVar9 = psVar12;
  puVar11 = puVar10;
  for (lVar8 = 0xe; lVar8 != 0; lVar8 = lVar8 + -1) {
    *(size_t *)puVar11 = *psVar9;
    psVar9 = psVar9 + (ulong)bVar17 * -2 + 1;
    puVar11 = puVar11 + (ulong)bVar17 * -0x10 + 8;
  }
  __x = &partialBlock.m_check_block_mock;
  std::
  function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>::
  function((function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>
            *)&local_430,__x);
  local_748 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_740 = "";
  local_758 = &boost::unit_test::basic_cstring<char_const>::null;
  local_750 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x62;
  file_06.m_begin = (iterator)&local_748;
  msg_06.m_end = pvVar15;
  msg_06.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_758,
             msg_06);
  local_818._0_8_ = (_func_int **)0x0;
  local_818[8] = false;
  local_818._9_7_ = 0;
  local_818._16_8_ = (pointer)0x0;
  _cVar20 = 0x2d6161;
  RVar4 = PartiallyDownloadedBlock::FillBlock
                    (&partialBlock,&block2,
                     (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      *)local_818);
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(RVar4 == READ_STATUS_INVALID);
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_4d8._0_8_ = "partialBlock.FillBlock(block2, {}) == READ_STATUS_INVALID";
  local_4d8._8_8_ = "";
  local_578._8_8_ = local_578._8_8_ & 0xffffffffffffff00;
  local_578._0_8_ = &PTR__lazy_ostream_013abc70;
  local_578._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_578._24_8_ = local_4d8;
  local_768 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_760 = "";
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)local_578,1,0,WARN,_cVar20,(size_t)&local_768,0x62);
  boost::detail::shared_count::~shared_count(&local_58.m_message.pn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_818);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator=(&partialBlock.txn_available,
              (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)&block3);
  psVar9 = psVar12;
  for (lVar8 = 0xe; lVar8 != 0; lVar8 = lVar8 + -1) {
    *psVar9 = *(size_t *)puVar10;
    puVar10 = puVar10 + (ulong)bVar17 * -0x10 + 8;
    psVar9 = psVar9 + (ulong)bVar17 * -2 + 1;
  }
  std::
  function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>::
  operator=(__x,(function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>
                 *)&local_430);
  if (local_420 != (code *)0x0) {
    (*local_420)(&local_430,&local_430,__destroy_functor);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&block3);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&block3,&partialBlock.txn_available);
  puVar10 = block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x14;
  psVar9 = psVar12;
  puVar11 = puVar10;
  for (lVar8 = 0xe; lVar8 != 0; lVar8 = lVar8 + -1) {
    *(size_t *)puVar11 = *psVar9;
    psVar9 = psVar9 + (ulong)bVar17 * -2 + 1;
    puVar11 = puVar11 + (ulong)bVar17 * -0x10 + 8;
  }
  std::
  function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>::
  function((function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>
            *)&local_430,__x);
  local_58._0_8_ =
       block.vtx.
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_start[2].
       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar2 = (element_type *)
           block.vtx.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start[2].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_58.m_message.px = peVar2;
  if (peVar2 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = (_Atomic_word *)
               &(peVar2->m_stream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
      *p_Var1 = *p_Var1 + 1;
      UNLOCK();
    }
    else {
      p_Var1 = (_Atomic_word *)
               &(peVar2->m_stream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
      *p_Var1 = *p_Var1 + 1;
    }
  }
  __l._M_len = 1;
  __l._M_array = (iterator)&local_58;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)local_578,__l,(allocator_type *)local_818);
  PartiallyDownloadedBlock::FillBlock
            (&partialBlock,&block2,
             (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)local_578);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_578);
  if (local_58.m_message.px != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.m_message.px);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator=(&partialBlock.txn_available,
              (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)&block3);
  for (lVar8 = 0xe; lVar8 != 0; lVar8 = lVar8 + -1) {
    *psVar12 = *(size_t *)puVar10;
    puVar10 = puVar10 + (ulong)bVar17 * -0x10 + 8;
    psVar12 = psVar12 + (ulong)bVar17 * -2 + 1;
  }
  std::
  function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>::
  operator=(__x,(function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>
                 *)&local_430);
  if (local_420 != (code *)0x0) {
    (*local_420)(&local_430,&local_430,__destroy_functor);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&block3);
  local_780 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_778 = "";
  local_790 = &boost::unit_test::basic_cstring<char_const>::null;
  local_788 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x6d;
  file_07.m_begin = (iterator)&local_780;
  msg_07.m_end = pvVar15;
  msg_07.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_790,
             msg_07);
  _cVar20 = 0x2d63ef;
  BlockMerkleRoot((uint256 *)&block3,&block2,&mutated);
  auVar18[0] = -(block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] ==
                (uchar)block3.super_CBlockHeader.nVersion);
  auVar18[1] = -(block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] ==
                block3.super_CBlockHeader.nVersion._1_1_);
  auVar18[2] = -(block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] ==
                block3.super_CBlockHeader.nVersion._2_1_);
  auVar18[3] = -(block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] ==
                block3.super_CBlockHeader.nVersion._3_1_);
  auVar18[4] = -(block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] ==
                block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0]);
  auVar18[5] = -(block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] ==
                block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1]);
  auVar18[6] = -(block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] ==
                block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2]);
  auVar18[7] = -(block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] ==
                block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3]);
  auVar18[8] = -(block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] ==
                block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4]);
  auVar18[9] = -(block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] ==
                block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5]);
  auVar18[10] = -(block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10]
                 == block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6]
                 );
  auVar18[0xb] = -(block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0xb] == block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data.
                            _M_elems[7]);
  auVar18[0xc] = -(block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0xc] == block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data.
                            _M_elems[8]);
  auVar18[0xd] = -(block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0xd] == block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data.
                            _M_elems[9]);
  auVar18[0xe] = -(block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0xe] == block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data.
                            _M_elems[10]);
  auVar18[0xf] = -(block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0xf] == block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data.
                            _M_elems[0xb]);
  auVar19[0] = -(block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc]
                == block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0x10]);
  auVar19[1] = -(block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd]
                == block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0x11]);
  auVar19[2] = -(block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe]
                == block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0x12]);
  auVar19[3] = -(block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf]
                == block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0x13]);
  auVar19[4] = -(block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10]
                == block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0x14]);
  auVar19[5] = -(block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11]
                == block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0x15]);
  auVar19[6] = -(block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12]
                == block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0x16]);
  auVar19[7] = -(block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13]
                == block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0x17]);
  auVar19[8] = -(block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14]
                == block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0x18]);
  auVar19[9] = -(block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15]
                == block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0x19]);
  auVar19[10] = -(block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                  [0x16] ==
                 block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a]
                 );
  auVar19[0xb] = -(block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                   [0x17] ==
                  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [0x1b]);
  auVar19[0xc] = -(block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                   [0x18] ==
                  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [0x1c]);
  auVar19[0xd] = -(block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                   [0x19] ==
                  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [0x1d]);
  auVar19[0xe] = -(block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                   [0x1a] ==
                  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [0x1e]);
  auVar19[0xf] = -(block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                   [0x1b] ==
                  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [0x1f]);
  auVar18 = auVar18 & auVar19;
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_818._8_8_ = "";
  local_818._0_8_ = "block.hashMerkleRoot != BlockMerkleRoot(block2, &mutated)";
  local_578._8_8_ = local_578._8_8_ & 0xffffffffffffff00;
  local_578._0_8_ = &PTR__lazy_ostream_013abc70;
  local_578._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_7a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_798 = "";
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x0;
  local_578._24_8_ = (allocator_type *)local_818;
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) != 0xffff);
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)local_578,1,0,WARN,_cVar20,(size_t)&local_7a0,0x6d);
  boost::detail::shared_count::~shared_count(&local_58.m_message.pn);
  block3.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  block3.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  block3.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  block3.super_CBlockHeader.nTime = 0;
  block3.super_CBlockHeader.nBits = 0;
  block3.super_CBlockHeader.nNonce = 0;
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block3.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  block3.super_CBlockHeader.nVersion = 0;
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block3.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  block3.fChecked = false;
  block3.m_checked_witness_commitment = false;
  block3.m_checked_merkle_root = false;
  local_7b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_7a8 = "";
  local_7c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x70;
  file_08.m_begin = (iterator)&local_7b0;
  msg_08.m_end = pvVar15;
  msg_08.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_7c0,
             msg_08);
  local_4d8._0_8_ =
       block.vtx.
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1].
       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_4d8._8_8_ =
       block.vtx.
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1].
       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
       *)local_4d8._8_8_ !=
      (hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
       *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = (_Atomic_word *)
               ((long)&(((hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                          *)local_4d8._8_8_)->
                       super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                       ).
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                       .
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                       .
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                       .super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>.
                       super_pod_value_holder<CTxMemPoolEntry> + 8);
      *p_Var1 = *p_Var1 + 1;
      UNLOCK();
    }
    else {
      p_Var1 = (_Atomic_word *)
               ((long)&(((hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                          *)local_4d8._8_8_)->
                       super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                       ).
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                       .
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                       .
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                       .super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>.
                       super_pod_value_holder<CTxMemPoolEntry> + 8);
      *p_Var1 = *p_Var1 + 1;
    }
  }
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_4d8;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)local_818,__l_00,(allocator_type *)local_518);
  _cVar20 = 0x2d660e;
  RVar4 = PartiallyDownloadedBlock::FillBlock
                    (&partialBlock,&block3,
                     (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      *)local_818);
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(RVar4 == READ_STATUS_OK);
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_4f8._M_dataplus._M_p = "partialBlock.FillBlock(block3, {block.vtx[1]}) == READ_STATUS_OK";
  local_4f8._M_string_length = 0xe62936;
  local_578._8_8_ = local_578._8_8_ & 0xffffffffffffff00;
  local_578._0_8_ = &PTR__lazy_ostream_013abc70;
  local_578._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_578._24_8_ = &local_4f8;
  local_7d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_7c8 = "";
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)local_578,1,0,WARN,_cVar20,(size_t)&local_7d0,0x70);
  boost::detail::shared_count::~shared_count(&local_58.m_message.pn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_818);
  if ((hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
       *)local_4d8._8_8_ !=
      (hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
       *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4d8._8_8_);
  }
  local_7e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_7d8 = "";
  local_818._40_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_818._48_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x71;
  file_09.m_begin = (iterator)&local_7e0;
  msg_09.m_end = pvVar15;
  msg_09.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,
             (size_t)(local_818 + 0x28),msg_09);
  local_818[8] = 0;
  local_818._0_8_ = &PTR__lazy_ostream_013abb30;
  local_818._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_818._24_8_ = "";
  CBlockHeader::GetHash((uint256 *)&local_4f8,&block.super_CBlockHeader);
  base_blob<256u>::ToString_abi_cxx11_((string *)local_4d8,&local_4f8);
  CBlockHeader::GetHash((uint256 *)local_538,&block3.super_CBlockHeader);
  base_blob<256u>::ToString_abi_cxx11_((string *)local_518,local_538);
  if (local_4d8._8_8_ == local_518._8_8_) {
    if ((hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
         *)local_4d8._8_8_ ==
        (hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
         *)0x0) {
      bVar3 = true;
    }
    else {
      iVar5 = bcmp((void *)local_4d8._0_8_,(void *)local_518._0_8_,local_4d8._8_8_);
      bVar3 = iVar5 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  local_598.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar3;
  local_598.m_message.px = (element_type *)0x0;
  local_598.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5a8 = (string *)0xe626f3;
  local_5a0 = "";
  local_578._8_8_ = local_578._8_8_ & 0xffffffffffffff00;
  local_578._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_578._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_40 = &local_5b0;
  local_58.m_message.px = (element_type *)(local_58.m_message._1_8_ << 8);
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x2;
  local_5b0 = (string *)local_518;
  local_580 = (string *)local_4d8;
  local_578._24_8_ = &local_580;
  boost::test_tools::tt_detail::report_assertion
            (&local_598,(lazy_ostream *)local_818,1,2,REQUIRE,0xe62937,(size_t)&local_5a8,0x71,
             (lazy_ostream *)local_578,"block3.GetHash().ToString()",&local_58);
  boost::detail::shared_count::~shared_count(&local_598.m_message.pn);
  if ((undefined1 *)local_518._0_8_ != local_518 + 0x10) {
    operator_delete((void *)local_518._0_8_,(ulong)(local_518._16_8_ + 1));
  }
  if ((element_type *)local_4d8._0_8_ != (element_type *)local_4c8) {
    operator_delete((void *)local_4d8._0_8_,local_4c8._0_8_ + 1);
  }
  local_828 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_820 = "";
  local_838 = &boost::unit_test::basic_cstring<char_const>::null;
  local_830 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x72;
  file_10.m_begin = (iterator)&local_828;
  msg_10.m_end = pvVar15;
  msg_10.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_838,
             msg_10);
  local_818[8] = 0;
  local_818._0_8_ = &PTR__lazy_ostream_013abb30;
  local_818._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_818._24_8_ = "";
  base_blob<256u>::ToString_abi_cxx11_((string *)local_4d8,&block.super_CBlockHeader.hashMerkleRoot)
  ;
  BlockMerkleRoot((uint256 *)local_518,&block3,&mutated);
  base_blob<256u>::ToString_abi_cxx11_(&local_4f8,local_518);
  if (local_4d8._8_8_ == local_4f8._M_string_length) {
    if ((hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
         *)local_4d8._8_8_ ==
        (hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
         *)0x0) {
      rVar16.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar5 = bcmp((void *)local_4d8._0_8_,local_4f8._M_dataplus._M_p,local_4d8._8_8_);
      rVar16.super_class_property<bool>.value = (class_property<bool>)(iVar5 == 0);
    }
  }
  else {
    rVar16.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_538[0] = rVar16.super_class_property<bool>.value;
  local_538._8_8_ = (element_type *)0x0;
  asStack_528[0].pi_ = (sp_counted_base *)0x0;
  local_598._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_598.m_message.px = (element_type *)0xe62760;
  local_578._8_8_ = local_578._8_8_ & 0xffffffffffffff00;
  local_578._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_578._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_58.m_message.px = (element_type *)(local_58.m_message._1_8_ << 8);
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x2;
  local_5a8 = (string *)local_4d8;
  local_580 = &local_4f8;
  local_578._24_8_ = &local_5a8;
  local_40 = &local_580;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_538,(lazy_ostream *)local_818,1,2,REQUIRE,0xe6296e,
             (size_t)&local_598,0x72,(lazy_ostream *)local_578,
             "BlockMerkleRoot(block3, &mutated).ToString()",&local_58);
  boost::detail::shared_count::~shared_count(asStack_528);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  if ((element_type *)local_4d8._0_8_ != (element_type *)local_4c8) {
    operator_delete((void *)local_4d8._0_8_,local_4c8._0_8_ + 1);
  }
  local_848 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_840 = "";
  local_858 = &boost::unit_test::basic_cstring<char_const>::null;
  local_850 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar20 = 0x2d6b39;
  file_11.m_end = (iterator)0x73;
  file_11.m_begin = (iterator)&local_848;
  msg_11.m_end = pvVar15;
  msg_11.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_858,
             msg_11);
  local_58._0_8_ = CONCAT71(local_58._1_7_,mutated) ^ 1;
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_818._8_8_ = "";
  local_818._0_8_ = "!mutated";
  local_578._8_8_ = local_578._8_8_ & 0xffffffffffffff00;
  local_578._0_8_ = &PTR__lazy_ostream_013abc70;
  local_578._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_868 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_860 = "";
  local_578._24_8_ = (lazy_ostream *)local_818;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)local_578,1,0,WARN,_cVar20,(size_t)&local_868,0x73);
  boost::detail::shared_count::~shared_count(&local_58.m_message.pn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&block3.vtx);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&block2.vtx);
  if (partialBlock.m_check_block_mock.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*partialBlock.m_check_block_mock.super__Function_base._M_manager)
              ((_Any_data *)__x,(_Any_data *)__x,__destroy_functor);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&partialBlock.txn_available);
  std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>::~vector
            (&shortIDs2.prefilledtxn);
  if (shortIDs2.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(shortIDs2.shorttxids.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)shortIDs2.shorttxids.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)shortIDs2.shorttxids.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_638);
  std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>::~vector
            (&shortIDs.prefilledtxn);
  if (shortIDs.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(shortIDs.shorttxids.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)shortIDs.shorttxids.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)shortIDs.shorttxids.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&block.vtx);
  ChaCha20::~ChaCha20(&rand_ctx.rng);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(SimpleRoundTripTest)
{
    CTxMemPool& pool = *Assert(m_node.mempool);
    TestMemPoolEntryHelper entry;
    auto rand_ctx(FastRandomContext(uint256{42}));
    CBlock block(BuildBlockTestCase(rand_ctx));

    LOCK2(cs_main, pool.cs);
    pool.addUnchecked(entry.FromTx(block.vtx[2]));
    BOOST_CHECK_EQUAL(pool.get(block.vtx[2]->GetHash()).use_count(), SHARED_TX_OFFSET + 0);

    // Do a simple ShortTxIDs RT
    {
        CBlockHeaderAndShortTxIDs shortIDs{block, rand_ctx.rand64()};

        DataStream stream{};
        stream << shortIDs;

        CBlockHeaderAndShortTxIDs shortIDs2;
        stream >> shortIDs2;

        PartiallyDownloadedBlock partialBlock(&pool);
        BOOST_CHECK(partialBlock.InitData(shortIDs2, empty_extra_txn) == READ_STATUS_OK);
        BOOST_CHECK( partialBlock.IsTxAvailable(0));
        BOOST_CHECK(!partialBlock.IsTxAvailable(1));
        BOOST_CHECK( partialBlock.IsTxAvailable(2));

        BOOST_CHECK_EQUAL(pool.get(block.vtx[2]->GetHash()).use_count(), SHARED_TX_OFFSET + 1);

        size_t poolSize = pool.size();
        pool.removeRecursive(*block.vtx[2], MemPoolRemovalReason::REPLACED);
        BOOST_CHECK_EQUAL(pool.size(), poolSize - 1);

        CBlock block2;
        {
            PartiallyDownloadedBlock tmp = partialBlock;
            BOOST_CHECK(partialBlock.FillBlock(block2, {}) == READ_STATUS_INVALID); // No transactions
            partialBlock = tmp;
        }

        // Wrong transaction
        {
            PartiallyDownloadedBlock tmp = partialBlock;
            partialBlock.FillBlock(block2, {block.vtx[2]}); // Current implementation doesn't check txn here, but don't require that
            partialBlock = tmp;
        }
        bool mutated;
        BOOST_CHECK(block.hashMerkleRoot != BlockMerkleRoot(block2, &mutated));

        CBlock block3;
        BOOST_CHECK(partialBlock.FillBlock(block3, {block.vtx[1]}) == READ_STATUS_OK);
        BOOST_CHECK_EQUAL(block.GetHash().ToString(), block3.GetHash().ToString());
        BOOST_CHECK_EQUAL(block.hashMerkleRoot.ToString(), BlockMerkleRoot(block3, &mutated).ToString());
        BOOST_CHECK(!mutated);
    }
}